

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O0

Formula * __thiscall
Kernel::FormulaTransformer::applyQuantified(FormulaTransformer *this,Formula *f)

{
  Connective con;
  Formula *pFVar1;
  Formula *pFVar2;
  SList *ss;
  Formula *in_RSI;
  QuantifiedFormula *in_RDI;
  Formula *newArg;
  Formula *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  Formula::qarg((Formula *)0x858f02);
  pFVar1 = apply((FormulaTransformer *)in_RSI,in_stack_ffffffffffffffe0);
  pFVar2 = Formula::qarg((Formula *)0x858f28);
  local_8 = in_RSI;
  if (pFVar1 != pFVar2) {
    local_8 = (Formula *)QuantifiedFormula::operator_new(0x858f4e);
    con = Formula::connective(in_RSI);
    ss = (SList *)Formula::vars((Formula *)0x858f6d);
    pFVar1 = (Formula *)Formula::sorts((Formula *)0x858f7e);
    QuantifiedFormula::QuantifiedFormula(in_RDI,con,(VList *)local_8,ss,pFVar1);
  }
  return local_8;
}

Assistant:

Formula* FormulaTransformer::applyQuantified(Formula* f)
{
  Formula* newArg = apply(f->qarg());
  if(newArg==f->qarg()) {
    return f;
  }
  // 0 is for the sorts list
  return new QuantifiedFormula(f->connective(), f->vars(),f->sorts(), newArg);
}